

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall google::protobuf::MessageLite::AppendPartialToString(MessageLite *this,Cord *output)

{
  ulong *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  CordRepFlat *pCVar5;
  _Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  _Var6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint8_t *extraout_RAX;
  Nonnull<const_char_*> pcVar7;
  sbyte sVar8;
  _func_int **pp_Var9;
  ulong uVar10;
  unsigned_long v2;
  byte bVar11;
  uint uVar12;
  sbyte sVar13;
  size_t sVar14;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Var15;
  string_view str;
  Span<char> SVar16;
  CordBuffer buffer;
  CordOutputStream output_stream;
  EpsCopyOutputStream out;
  anon_union_16_2_39e9c77e_for_Rep_0 local_108;
  anon_union_16_2_b9f6da03_for_Rep_1 local_f8;
  anon_union_16_2_b9f6da03_for_Rep_1 local_e8;
  undefined1 local_d8 [24];
  CordOutputStream local_c0;
  anon_union_16_2_39e9c77e_for_Rep_0 local_88;
  undefined1 local_70 [48];
  CordOutputStream *local_40;
  undefined2 local_38;
  bool local_36;
  bool local_35;
  _func_int **len;
  uint8_t *v1;
  
  iVar3 = (*this->_vptr_MessageLite[3])();
  len = (_func_int **)CONCAT44(extraout_var,iVar3);
  uVar10 = (ulong)(output->contents_).data_.rep_.field_0.data[0];
  if ((uVar10 & 1) == 0) {
    if ((_func_int **)0x7fffffff < len) {
LAB_00244c29:
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                ((LogMessage *)local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                 ,0x296);
      str._M_str = "Exceeded maximum protobuf size of 2GB: ";
      str._M_len = 0x27;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)local_70,str);
      local_c0.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream = len;
      absl::lts_20250127::log_internal::LogMessage::operator<<<unsigned_long,_0>
                ((LogMessage *)local_70,(unsigned_long *)&local_c0);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)local_70);
      return false;
    }
    uVar10 = uVar10 >> 1;
  }
  else {
    if ((ulong)len >> 0x1f != 0) goto LAB_00244c29;
    uVar10 = ((output->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar10 == 0) {
    if ((_func_int **)0xf < len) {
      pCVar5 = absl::lts_20250127::cord_internal::CordRepFlat::NewImpl<4096ul>((size_t)len);
      (pCVar5->super_CordRep).length = 0;
      local_108.data[0] = (char)pCVar5;
      local_108.as_tree.cordz_info._1_7_ = (undefined7)((ulong)pCVar5 >> 8);
      goto LAB_002448bc;
    }
    local_108.data[0] = 1;
    local_108.as_tree.cordz_info._1_7_ = 0;
    local_108.data[8] = '\0';
    local_108._9_4_ = 0;
    local_108._13_2_ = 0;
    local_108.data[0xf] = '\0';
LAB_002448da:
    SVar16 = absl::lts_20250127::CordBuffer::Rep::short_available((Rep *)&local_108.as_tree);
  }
  else {
    absl::lts_20250127::Cord::GetAppendBufferSlowPath
              ((Cord *)&local_108.as_tree,(size_t)output,0,(size_t)len);
    pCVar5 = (CordRepFlat *)(ulong)(byte)local_108.data[0];
LAB_002448bc:
    if (((ulong)pCVar5 & 1) != 0) goto LAB_002448da;
    SVar16 = absl::lts_20250127::CordBuffer::Rep::long_available((Rep *)&local_108.as_tree);
  }
  _Var6.super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
       SVar16.ptr_;
  v2 = uVar10 + (long)len;
  uVar12 = (uint)SVar16.len_;
  if ((_func_int **)SVar16.len_ < len) {
    if ((local_108.data[0] & 1U) == 0) {
      bVar11 = *(byte *)((long)CONCAT71(local_108.as_tree.cordz_info._1_7_,local_108.data[0]) + 0xc)
      ;
      sVar13 = 0xc;
      if (bVar11 < 0xbb) {
        sVar13 = 6;
      }
      iVar3 = -0xb800d;
      if (bVar11 < 0xbb) {
        iVar3 = -0xe8d;
      }
      sVar8 = 3;
      if (0x42 < bVar11) {
        sVar8 = sVar13;
      }
      iVar4 = -0x1d;
      if (0x42 < bVar11) {
        iVar4 = iVar3;
      }
      *(long *)CONCAT71(local_108.as_tree.cordz_info._1_7_,local_108.data[0]) =
           (long)(int)(((uint)bVar11 << sVar8) + iVar4);
    }
    else {
      local_108.data[0] = 0x1f;
    }
    local_88.as_tree.cordz_info = (output->contents_).data_.rep_.field_0.as_tree.cordz_info;
    local_88.as_tree.rep = (output->contents_).data_.rep_.field_0.as_tree.rep;
    (output->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
    (output->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
    local_f8.short_rep.raw_size = local_108.data[0];
    local_f8._1_7_ = local_108.as_tree.cordz_info._1_7_;
    local_f8.short_rep.data[7] = local_108.data[8];
    local_f8._9_4_ = local_108._9_4_;
    local_f8._13_2_ = local_108._13_2_;
    local_f8.short_rep.data[0xe] = local_108.data[0xf];
    local_108.data[0] = 1;
    io::CordOutputStream::CordOutputStream
              (&local_c0,(Cord *)&local_88.as_tree,(CordBuffer *)&local_f8.long_rep,v2);
    if ((local_f8.short_rep.raw_size & 1U) == 0) {
      absl::lts_20250127::cord_internal::CordRepFlat::Delete
                ((CordRep *)CONCAT71(local_f8._1_7_,local_f8.short_rep.raw_size));
    }
    absl::lts_20250127::Cord::~Cord((Cord *)&local_88.as_tree);
    local_36 = (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
    local_38._0_1_ = false;
    local_38._1_1_ = false;
    local_70._0_8_ = local_70 + 0x10;
    if (0x10 < uVar12) {
      local_70._0_8_ =
           (char *)((long)_Var6.
                          super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                          ._M_head_impl + -0x10);
    }
    local_70._0_8_ = local_70._0_8_ + (long)SVar16.len_;
    _Var15._M_head_impl =
         (LogMessageData *)
         _Var6.
         super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
         ._M_head_impl;
    local_70._8_8_ =
         (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
         (_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          )0x0;
    if (0x10 >= uVar12) {
      _Var15._M_head_impl = (LogMessageData *)(local_70 + 0x10);
      local_70._8_8_ =
           _Var6.
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
    }
    local_35 = false;
    local_40 = &local_c0;
    iVar3 = (*this->_vptr_MessageLite[5])(this,_Var15._M_head_impl,local_70);
    io::EpsCopyOutputStream::Trim
              ((EpsCopyOutputStream *)local_70,(uint8_t *)CONCAT44(extraout_var_01,iVar3));
    bVar2 = local_38._0_1_;
    if (local_38._0_1_ == false) {
      io::CordOutputStream::Consume((CordOutputStream *)local_d8);
      if (((output->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
        absl::lts_20250127::Cord::InlineRep::UnrefTree(&output->contents_);
      }
      (output->contents_).data_.rep_.field_0.as_tree.cordz_info = local_d8._0_8_;
      (output->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)local_d8._8_8_;
      local_d8._0_8_ = (_func_int **)0x0;
      local_d8._8_8_ = (CordRep *)0x0;
      absl::lts_20250127::Cord::~Cord((Cord *)local_d8);
      uVar10 = (ulong)(output->contents_).data_.rep_.field_0.data[0];
      if ((uVar10 & 1) == 0) {
        sVar14 = uVar10 >> 1;
      }
      else {
        sVar14 = ((output->contents_).data_.rep_.field_0.as_tree.rep)->length;
      }
      if (sVar14 != v2) {
        pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                           (sVar14,v2,"output->size() == total_size");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                   ,0x2ba,pcVar7);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_d8);
      }
    }
    if ((local_c0.buffer_.rep_.field_0.short_rep.raw_size & 1U) == 0) {
      absl::lts_20250127::cord_internal::CordRepFlat::Delete
                ((CordRep *)
                 CONCAT71(local_c0.buffer_.rep_.field_0._1_7_,
                          local_c0.buffer_.rep_.field_0.short_rep.raw_size));
    }
    bVar11 = bVar2 ^ 1;
    absl::lts_20250127::Cord::~Cord(&local_c0.cord_);
    goto LAB_00244c06;
  }
  local_36 = (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
  local_70._0_8_ =
       (long)(int)uVar12 +
       (long)_Var6.
             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
             ._M_head_impl;
  local_70._8_8_ = (LogMessageData *)0x0;
  local_40 = (CordOutputStream *)0x0;
  local_38._0_1_ = false;
  local_38._1_1_ = false;
  local_35 = false;
  iVar4 = (*this->_vptr_MessageLite[5])
                    (this,_Var6.
                          super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                          ._M_head_impl);
  v1 = (uint8_t *)CONCAT44(extraout_var_00,iVar4);
  if (v1 == (uint8_t *)
            ((long)_Var6.
                   super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl + (long)len)) {
    if ((local_108.data[0] & 1U) == 0) {
      puVar1 = (ulong *)CONCAT71(local_108.as_tree.cordz_info._1_7_,local_108.data[0]);
      bVar11 = *(byte *)((long)puVar1 + 0xc);
      sVar13 = 0xc;
      if (bVar11 < 0xbb) {
        sVar13 = 6;
      }
      iVar3 = -0xb800d;
      if (bVar11 < 0xbb) {
        iVar3 = -0xe8d;
      }
      sVar8 = 3;
      if (0x42 < bVar11) {
        sVar8 = sVar13;
      }
      iVar4 = -0x1d;
      if (0x42 < bVar11) {
        iVar4 = iVar3;
      }
      pp_Var9 = (_func_int **)(long)(int)(((uint)bVar11 << sVar8) + iVar4);
      if ((pp_Var9 < len) || (pp_Var9 < (_func_int **)(*puVar1 + (long)len))) {
LAB_00244c7f:
        AppendPartialToString();
        v1 = extraout_RAX;
        goto LAB_00244c84;
      }
      *puVar1 = *puVar1 + (long)len;
    }
    else {
      if (((_func_int **)0xf < len) || (0xf < (ulong)((long)len + (long)(local_108.data[0] >> 1))))
      goto LAB_00244c7f;
      local_108.data[0] = local_108.data[0] + (char)iVar3 * '\x02';
    }
    local_e8.short_rep.raw_size = local_108.data[0];
    local_e8._1_7_ = local_108.as_tree.cordz_info._1_7_;
    local_e8.short_rep.data[7] = local_108.data[8];
    local_e8._9_4_ = local_108._9_4_;
    local_e8._13_2_ = local_108._13_2_;
    local_e8.short_rep.data[0xe] = local_108.data[0xf];
    local_108.data[0] = 1;
    absl::lts_20250127::Cord::Append(output,(CordBuffer *)&local_e8.long_rep);
    if ((local_e8.short_rep.raw_size & 1U) == 0) {
      absl::lts_20250127::cord_internal::CordRepFlat::Delete
                ((CordRep *)CONCAT71(local_e8._1_7_,local_e8.short_rep.raw_size));
    }
    uVar10 = (ulong)(output->contents_).data_.rep_.field_0.data[0];
    if ((uVar10 & 1) == 0) {
      sVar14 = uVar10 >> 1;
    }
    else {
      sVar14 = ((output->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    if (sVar14 == v2) {
      bVar11 = 1;
LAB_00244c06:
      if ((local_108.data[0] & 1U) == 0) {
        absl::lts_20250127::cord_internal::CordRepFlat::Delete
                  ((CordRep *)CONCAT71(local_108.as_tree.cordz_info._1_7_,local_108.data[0]));
      }
      return (bool)bVar11;
    }
    pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (sVar14,v2,"output->size() == total_size");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x2aa,pcVar7);
  }
  else {
LAB_00244c84:
    pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (v1,(uint8_t *)
                           ((long)_Var6.
                                  super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                  ._M_head_impl + (long)len),
                        "static_cast<const void*>(res) == static_cast<const void*>(target + size)");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x2a7,pcVar7);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_c0);
}

Assistant:

bool MessageLite::AppendPartialToString(absl::Cord* output) const {
  // For efficiency, we'd like to pass a size hint to CordOutputStream with
  // the exact total size expected.
  const size_t size = ByteSizeLong();
  const size_t total_size = size + output->size();
  if (size > INT_MAX) {
    ABSL_LOG(ERROR) << "Exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }


  // Allocate a CordBuffer (which may utilize private capacity in 'output').
  absl::CordBuffer buffer = output->GetAppendBuffer(size);
  absl::Span<char> available = buffer.available();
  auto target = reinterpret_cast<uint8_t*>(available.data());
  if (available.size() >= size) {
    // Use EpsCopyOutputStream with full available capacity, as serialization
    // may in the future use the extra slop bytes if available.
    io::EpsCopyOutputStream out(
        target, static_cast<int>(available.size()),
        io::CodedOutputStream::IsDefaultSerializationDeterministic());
    auto res = _InternalSerialize(target, &out);
    ABSL_DCHECK_EQ(static_cast<const void*>(res),
                   static_cast<const void*>(target + size));
    buffer.IncreaseLengthBy(size);
    output->Append(std::move(buffer));
    ABSL_DCHECK_EQ(output->size(), total_size);
    return true;
  }

  // Donate the buffer to the CordOutputStream with length := capacity.
  // This follows the eager `EpsCopyOutputStream` initialization logic.
  buffer.SetLength(buffer.capacity());
  io::CordOutputStream output_stream(std::move(*output), std::move(buffer),
                                     total_size);
  io::EpsCopyOutputStream out(
      target, static_cast<int>(available.size()), &output_stream,
      io::CodedOutputStream::IsDefaultSerializationDeterministic(), &target);
  target = _InternalSerialize(target, &out);
  out.Trim(target);
  if (out.HadError()) return false;
  *output = output_stream.Consume();
  ABSL_DCHECK_EQ(output->size(), total_size);
  return true;
}